

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O0

int decrypt(EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  int iVar1;
  int iVar2;
  undefined4 local_68;
  undefined4 local_64;
  uchar *local_60;
  undefined4 local_54;
  uchar *puStack_50;
  int lowerfirstlast;
  ssize_t decryptlen;
  int blocksize;
  transportpacket *p;
  uchar *puStack_30;
  int firstlast_local;
  ssize_t len_local;
  uchar *dest_local;
  uchar *source_local;
  LIBSSH2_SESSION *session_local;
  
  iVar1 = *(int *)(*(long *)(ctx + 0x158) + 0x10);
  puStack_30 = in;
  len_local = (ssize_t)outlen;
  dest_local = out;
  if (((*(long *)(ctx + 0x1c8) == 0) || ((*(ulong *)(*(long *)(ctx + 0x1c8) + 0x20) & 2) == 0)) &&
     ((long)in % (long)iVar1 != 0)) {
    __assert_fail("(len % blocksize) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/palmin[P]libssh2/src/transport.c"
                  ,0x8b,
                  "int decrypt(LIBSSH2_SESSION *, unsigned char *, unsigned char *, ssize_t, int)");
  }
  while( true ) {
    if ((long)puStack_30 < 1) {
      return 0;
    }
    if ((long)iVar1 < (long)puStack_30) {
      local_60 = (uchar *)(long)iVar1;
    }
    else {
      local_60 = puStack_30;
    }
    puStack_50 = local_60;
    if ((inlen & 1) == 0) {
      local_68 = (int)inlen;
      if ((long)iVar1 < (long)puStack_30) {
        local_68 = 0;
      }
      local_64 = local_68;
    }
    else {
      local_64 = 1;
    }
    local_54 = local_64;
    if (((*(long *)(ctx + 0x1c8) != 0) && ((*(ulong *)(*(long *)(ctx + 0x1c8) + 0x20) & 2) != 0)) &&
       (((inlen & 2) != 0 && ((long)puStack_30 < (long)(iVar1 << 1))))) {
      puStack_50 = puStack_30;
      local_54 = 2;
    }
    iVar2 = (**(code **)(*(long *)(ctx + 0x158) + 0x30))
                      (ctx,dest_local,puStack_50,ctx + 0x160,local_54);
    if (iVar2 != 0) break;
    memcpy((void *)len_local,dest_local,(size_t)puStack_50);
    puStack_30 = puStack_30 + -(long)puStack_50;
    len_local = (ssize_t)(puStack_50 + len_local);
    dest_local = puStack_50 + (long)dest_local;
  }
  (**(code **)(ctx + 0x18))(*(undefined8 *)(ctx + 0x8b60),ctx);
  return -0xc;
}

Assistant:

static int
decrypt(LIBSSH2_SESSION * session, unsigned char *source,
        unsigned char *dest, ssize_t len, int firstlast)
{
    struct transportpacket *p = &session->packet;
    int blocksize = session->remote.crypt->blocksize;

    /* if we get called with a len that isn't an even number of blocksizes
       we risk losing those extra bytes. AAD is an exception, since those first
       few bytes aren't encrypted so it throws off the rest of the count. */
    if(!CRYPT_FLAG_L(session, PKTLEN_AAD))
        assert((len % blocksize) == 0);

    while(len > 0) {
        /* normally decrypt up to blocksize bytes at a time */
        ssize_t decryptlen = LIBSSH2_MIN(blocksize, len);
        /* The first block is special (since it needs to be decoded to get the
           length of the remainder of the block) and takes priority. When the
           length finally gets to the last blocksize bytes, and there's no
           more data to come, it's the end. */
        int lowerfirstlast = IS_FIRST(firstlast) ? FIRST_BLOCK :
            ((len <= blocksize) ? firstlast : MIDDLE_BLOCK);
        /* If the last block would be less than a whole blocksize, combine it
           with the previous block to make it larger. This ensures that the
           whole MAC is included in a single decrypt call. */
        if(CRYPT_FLAG_L(session, PKTLEN_AAD) && IS_LAST(firstlast)
           && (len < blocksize*2)) {
            decryptlen = len;
            lowerfirstlast = LAST_BLOCK;
        }

        if(session->remote.crypt->crypt(session, source, decryptlen,
                                        &session->remote.crypt_abstract,
                                        lowerfirstlast)) {
            LIBSSH2_FREE(session, p->payload);
            return LIBSSH2_ERROR_DECRYPT;
        }

        /* if the crypt() function would write to a given address it
           wouldn't have to memcpy() and we could avoid this memcpy()
           too */
        memcpy(dest, source, decryptlen);

        len -= decryptlen;       /* less bytes left */
        dest += decryptlen;      /* advance write pointer */
        source += decryptlen;    /* advance read pointer */
    }
    return LIBSSH2_ERROR_NONE;         /* all is fine */
}